

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

bool __thiscall FM::OPNA::LoadRhythmSample(OPNA *this,char *path)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  char *__src;
  Rhythm *pRVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  int16 *dest;
  OPNA *pOVar7;
  uint size;
  undefined1 auVar8 [16];
  uint8 subchunkname [4];
  anon_struct_24_8_03634c04 whdr;
  char buf [2049];
  FileIO file;
  uint local_1094;
  OPNA *local_1090;
  int local_1084;
  char *local_1080;
  Rhythm *local_1078;
  int local_1070;
  short local_106c;
  short local_106a;
  uint local_1068;
  char local_1058 [4];
  undefined2 auStack_1054 [1026];
  FileIO local_850;
  long lVar9;
  
  auVar2 = _DAT_001a83d0;
  local_1078 = this->rhythm;
  lVar5 = 0;
  auVar8 = _DAT_001a83c0;
  do {
    if (SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffffa) {
      *(undefined4 *)((long)&this->rhythm[0].pos + lVar5) = 0xffffffff;
      *(undefined4 *)((long)&this->rhythm[1].pos + lVar5) = 0xffffffff;
    }
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar9 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xc0);
  lVar5 = 0;
  local_1090 = this;
  local_1080 = path;
  while( true ) {
    __src = local_1080;
    FileIO::FileIO(&local_850);
    memset(local_1058,0,0x801);
    if (__src != (char *)0x0) {
      strncpy(local_1058,__src,0x800);
    }
    sVar6 = strlen(local_1058);
    builtin_strncpy(local_1058 + sVar6,"2608",4);
    *(undefined2 *)((long)auStack_1054 + sVar6) = 0x5f;
    strncat(local_1058,
            (char *)((long)&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel +
                    (long)(int)(&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel)[lVar5]),0x800)
    ;
    sVar6 = strlen(local_1058);
    builtin_strncpy(local_1058 + sVar6,".wav",4);
    *(undefined1 *)((long)auStack_1054 + sVar6) = 0;
    bVar4 = FileIO::Open(&local_850,local_1058,2);
    if (!bVar4) {
      if (lVar5 != 5) break;
      strncpy(local_1058,"2608_rym.wav",0x800);
      bVar4 = FileIO::Open(&local_850,local_1058,2);
      if (!bVar4) break;
    }
    FileIO::Seek(&local_850,0x10,begin);
    FileIO::Read(&local_850,&local_1070,0x18);
    local_1094 = local_1070 - 0x14;
    do {
      FileIO::Seek(&local_850,local_1094,current);
      FileIO::Read(&local_850,&local_1084,4);
      FileIO::Read(&local_850,&local_1094,4);
    } while (local_1084 != 0x61746164);
    if (((0x1fffff < local_1094) || (local_106c != 1)) || (local_106a != 1)) break;
    size = local_1094 & 0x1ffffe;
    local_1094 = local_1094 >> 1;
    dest = (int16 *)operator_new__((ulong)size);
    pRVar3 = local_1078;
    local_1078[lVar5].sample = dest;
    FileIO::Read(&local_850,dest,size);
    pRVar3[lVar5].rate = local_1068;
    pRVar3[lVar5].step = (local_1068 << 10) / (local_1090->super_OPNABase).super_OPNBase.rate;
    pRVar3[lVar5].size = local_1094 << 10;
    pRVar3[lVar5].pos = local_1094 << 10;
    FileIO::~FileIO(&local_850);
    lVar5 = lVar5 + 1;
    if (lVar5 == 6) {
      return true;
    }
  }
  FileIO::~FileIO(&local_850);
  bVar4 = (int)lVar5 == 6;
  if (bVar4) {
    return true;
  }
  lVar5 = 0;
  pOVar7 = local_1090;
  do {
    pvVar1 = *(void **)((long)&pOVar7->rhythm[0].sample + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
      pOVar7 = local_1090;
    }
    *(undefined8 *)((long)&pOVar7->rhythm[0].sample + lVar5) = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0xc0);
  return bVar4;
}

Assistant:

bool OPNA::LoadRhythmSample(const char* path)
{
	static const char* rhythmname[6] =
	{
		"bd", "sd", "top", "hh", "tom", "rim",
	};

	int i;
	for (i=0; i<6; i++)
		rhythm[i].pos = ~0u;

	for (i=0; i<6; i++)
	{
		FileIO file;
		uint32 fsize;
		char buf[MAX_PATH + 1] = "";
		if (path)
			strncpy(buf, path, MAX_PATH);
		strncat(buf, "2608_", MAX_PATH);
		strncat(buf, rhythmname[i], MAX_PATH);
		strncat(buf, ".wav", MAX_PATH);

		if (!file.Open(buf, FileIO::readonly))
		{
			if (i != 5)
				break;
			if (path)
				strncpy(buf, path, MAX_PATH);
			strncpy(buf, "2608_rym.wav", MAX_PATH);
			if (!file.Open(buf, FileIO::readonly))
				break;
		}

		struct
		{
			uint32 chunksize;
			uint16 tag;
			uint16 nch;
			uint32 rate;
			uint32 avgbytes;
			uint16 align;
			uint16 bps;
			uint16 size;
		} whdr;

		file.Seek(0x10, FileIO::begin);
		file.Read(&whdr, sizeof(whdr));

		uint8 subchunkname[4];
		fsize = 4 + whdr.chunksize - sizeof(whdr);
		do
		{
			file.Seek(fsize, FileIO::current);
			file.Read(&subchunkname, 4);
			file.Read(&fsize, 4);
		} while (memcmp("data", subchunkname, 4));

		fsize /= 2;
		if (fsize >= 0x100000 || whdr.tag != 1 || whdr.nch != 1)
			break;
		fsize = Max(fsize, (1<<31)/1024);

		if(!rhythm[i].sample)
			delete rhythm[i].sample;
		rhythm[i].sample = new int16[fsize];
		if (!rhythm[i].sample)
			break;

		file.Read(rhythm[i].sample, fsize * 2);

		rhythm[i].rate = whdr.rate;
		rhythm[i].step = rhythm[i].rate * 1024 / rate;
		rhythm[i].pos = rhythm[i].size = fsize * 1024;
	}
	if (i != 6)
	{
		for (i=0; i<6; i++)
		{
			delete[] rhythm[i].sample;
			rhythm[i].sample = 0;
		}
		return false;
	}
	return true;
}